

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int geopolyFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
                 sqlite3_value **argv)

{
  long lVar1;
  RtreeNode *pNode;
  Rtree *pRtree_00;
  sqlite3 *psVar2;
  undefined4 in_ECX;
  int in_ESI;
  Rtree *in_RDI;
  sqlite3_value *in_R8;
  long in_FS_OFFSET;
  RtreeSearchPoint *pNew;
  RtreeConstraint *p_1;
  i64 iRowid;
  RtreeSearchPoint *p;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  i64 iNode;
  RtreeNode *pLeaf;
  int iCell;
  int rc;
  RtreeNode *pRoot;
  RtreeCoord bbox [4];
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Rtree *in_stack_ffffffffffffff70;
  sqlite3_int64 *in_stack_ffffffffffffff78;
  u8 iLevel;
  RtreeDValue in_stack_ffffffffffffff80;
  RtreeCursor *in_stack_ffffffffffffff88;
  RtreeCursor *pCur;
  RtreeCoord *aCoord;
  undefined4 in_stack_ffffffffffffffa8;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aCoord = (RtreeCoord *)(in_RDI->base).pModule;
  rtreeReference((Rtree *)aCoord);
  resetCursor((RtreeCursor *)in_RDI);
  *(int *)&(in_RDI->base).field_0xc = in_ESI;
  if (in_ESI == 1) {
    pCur = (RtreeCursor *)&DAT_aaaaaaaaaaaaaaaa;
    pNode = (RtreeNode *)sqlite3_value_int64((sqlite3_value *)0x2a3069);
    local_24 = findLeafNode(in_RDI,(i64)pCur,(RtreeNode **)pNode,in_stack_ffffffffffffff78);
    if (local_24 == 0) {
      pRtree_00 = (Rtree *)rtreeSearchPointNew(pCur,(RtreeDValue)pNode,
                                               (u8)((ulong)in_stack_ffffffffffffff78 >> 0x38));
      *(undefined1 **)&in_RDI->nCursor = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined8 *)&(pRtree_00->base).nRef = 0;
      *(undefined1 *)((long)&(pRtree_00->base).zErrMsg + 1) = 1;
      local_24 = nodeRowidIndex(pRtree_00,pNode,(i64)in_stack_ffffffffffffff78,
                                (int *)in_stack_ffffffffffffff70);
      *(undefined1 *)((long)&(pRtree_00->base).zErrMsg + 2) = 0;
    }
    else {
      *(undefined1 *)&(in_RDI->base).nRef = 1;
    }
  }
  else {
    local_24 = nodeAcquire((Rtree *)CONCAT44(in_ECX,in_stack_ffffffffffffffa8),(i64)in_R8,
                           (RtreeNode *)aCoord,(RtreeNode **)in_RDI);
    iLevel = (u8)((ulong)in_stack_ffffffffffffff78 >> 0x38);
    if ((local_24 == 0) && (in_ESI < 4)) {
      geopolyBBox((sqlite3_context *)CONCAT44(in_ECX,in_stack_ffffffffffffffa8),in_R8,aCoord,
                  (int *)in_RDI);
      psVar2 = (sqlite3 *)sqlite3_malloc(in_stack_ffffffffffffff6c);
      in_RDI->db = psVar2;
      *(int *)&(in_RDI->base).zErrMsg = 4;
      if (psVar2 == (sqlite3 *)0x0) {
        local_24 = 7;
        iLevel = '\0';
      }
      else {
        memset(in_RDI->db,0,0x60);
        memset(&in_RDI->pDeleteNode,0,(long)(aCoord[0xb].i + 1) << 2);
        if (in_ESI == 2) {
          *(int *)((long)&psVar2->pVfs + 4) = 0x42;
          *(int *)&psVar2->pVfs = 0;
          ((anon_union_8_3_38d9399b_for_u *)&psVar2->pVdbe)->rValue = -NAN;
          *(undefined4 *)((long)&psVar2->mutex + 4) = 0x44;
          *(undefined4 *)&psVar2->mutex = 1;
          psVar2->aDb = (Db *)0xfff8000000000000;
          *(undefined4 *)((long)&psVar2->flags + 4) = 0x42;
          *(undefined4 *)&psVar2->flags = 2;
          psVar2->lastRowid = -0x8000000000000;
          psVar2->openFlags = 0x44;
          psVar2->nSchemaLock = 3;
          psVar2->errCode = 0;
          psVar2->errByteOffset = -0x80000;
        }
        else {
          *(int *)((long)&psVar2->pVfs + 4) = 0x44;
          *(int *)&psVar2->pVfs = 0;
          ((anon_union_8_3_38d9399b_for_u *)&psVar2->pVdbe)->rValue = -NAN;
          *(undefined4 *)((long)&psVar2->mutex + 4) = 0x42;
          *(undefined4 *)&psVar2->mutex = 1;
          psVar2->aDb = (Db *)0xfff8000000000000;
          *(undefined4 *)((long)&psVar2->flags + 4) = 0x44;
          *(undefined4 *)&psVar2->flags = 2;
          psVar2->lastRowid = -0x8000000000000;
          psVar2->openFlags = 0x42;
          psVar2->nSchemaLock = 3;
          psVar2->errCode = 0;
          psVar2->errByteOffset = -0x80000;
        }
        iLevel = (u8)((ulong)&psVar2->nSchemaLock >> 0x38);
      }
    }
    if (local_24 == 0) {
      in_stack_ffffffffffffff70 =
           (Rtree *)rtreeSearchPointNew(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iLevel);
      if (in_stack_ffffffffffffff70 == (Rtree *)0x0) {
        local_24 = 7;
      }
      else {
        *(sqlite3_int64 *)&(in_stack_ffffffffffffff70->base).nRef = 1;
        *(u8 *)((long)&(in_stack_ffffffffffffff70->base).zErrMsg + 2) = '\0';
        *(u8 *)((long)&(in_stack_ffffffffffffff70->base).zErrMsg + 1) = '\x01';
        *(RtreeNode **)&in_RDI->nCursor = (RtreeNode *)0x0;
        local_24 = rtreeStepToLeaf((RtreeCursor *)CONCAT44(in_ECX,in_stack_ffffffffffffffa8));
      }
    }
  }
  nodeRelease(in_stack_ffffffffffffff70,
              (RtreeNode *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  rtreeRelease((Rtree *)0x2a349b);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int geopolyFilter(
  sqlite3_vtab_cursor *pVtabCursor,     /* The cursor to initialize */
  int idxNum,                           /* Query plan */
  const char *idxStr,                   /* Not Used */
  int argc, sqlite3_value **argv        /* Parameters to the query plan */
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int rc = SQLITE_OK;
  int iCell = 0;
  (void)idxStr;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  resetCursor(pCsr);

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array
    ** with the configured constraints.
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && idxNum<=3 ){
      RtreeCoord bbox[4];
      RtreeConstraint *p;
      assert( argc==1 );
      assert( argv[0]!=0 );
      geopolyBBox(0, argv[0], bbox, &rc);
      if( rc ){
        goto geopoly_filter_end;
      }
      pCsr->aConstraint = p = sqlite3_malloc(sizeof(RtreeConstraint)*4);
      pCsr->nConstraint = 4;
      if( p==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*4);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        if( idxNum==2 ){
          /* Overlap query */
          p->op = 'B';
          p->iCoord = 0;
          p->u.rValue = bbox[1].f;
          p++;
          p->op = 'D';
          p->iCoord = 1;
          p->u.rValue = bbox[0].f;
          p++;
          p->op = 'B';
          p->iCoord = 2;
          p->u.rValue = bbox[3].f;
          p++;
          p->op = 'D';
          p->iCoord = 3;
          p->u.rValue = bbox[2].f;
        }else{
          /* Within query */
          p->op = 'D';
          p->iCoord = 0;
          p->u.rValue = bbox[0].f;
          p++;
          p->op = 'B';
          p->iCoord = 1;
          p->u.rValue = bbox[1].f;
          p++;
          p->op = 'D';
          p->iCoord = 2;
          p->u.rValue = bbox[2].f;
          p++;
          p->op = 'B';
          p->iCoord = 3;
          p->u.rValue = bbox[3].f;
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
        goto geopoly_filter_end;
      }
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

geopoly_filter_end:
  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}